

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O3

MPP_RET enc_impl_proc_cfg(EncImpl impl,MpiCmd cmd,void *para)

{
  code *UNRECOVERED_JUMPTABLE;
  MPP_RET MVar1;
  undefined4 in_register_00000034;
  
  if (impl == (EncImpl)0x0) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_proc_cfg");
    return MPP_ERR_NULL_PTR;
  }
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)impl + 0x18) + 0x28);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    MVar1 = (*UNRECOVERED_JUMPTABLE)
                      (*(undefined8 *)((long)impl + 0x20),CONCAT44(in_register_00000034,cmd));
    return MVar1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET enc_impl_proc_cfg(EncImpl impl, MpiCmd cmd, void *para)
{
    if (NULL == impl) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_OK;
    EncImplCtx *p = (EncImplCtx *)impl;
    if (p->api->proc_cfg)
        ret = p->api->proc_cfg(p->ctx, cmd, para);

    return ret;
}